

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O1

void __thiscall xmrig::Api::onConfigChanged(Api *this,Config *config,Config *previousConfig)

{
  bool bVar1;
  String *pSVar2;
  
  pSVar2 = &(config->super_BaseConfig).m_apiId;
  bVar1 = String::isEqual(pSVar2,&(previousConfig->super_BaseConfig).m_apiId);
  if (!bVar1) {
    genId(this,pSVar2);
  }
  pSVar2 = &(config->super_BaseConfig).m_apiWorkerId;
  bVar1 = String::isEqual(pSVar2,&(previousConfig->super_BaseConfig).m_apiWorkerId);
  if (bVar1) {
    return;
  }
  genWorkerId(this,pSVar2);
  return;
}

Assistant:

void xmrig::Api::onConfigChanged(Config *config, Config *previousConfig)
{
    if (config->apiId() != previousConfig->apiId()) {
        genId(config->apiId());
    }

    if (config->apiWorkerId() != previousConfig->apiWorkerId()) {
        genWorkerId(config->apiWorkerId());
    }
}